

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

int8_t hex_to_char(char hex)

{
  uint8_t c;
  char hex_local;
  
  if (((byte)hex < 0x30) || (0x39 < (byte)hex)) {
    if (((byte)hex < 0x41) || (0x46 < (byte)hex)) {
      if (((byte)hex < 0x61) || (0x66 < (byte)hex)) {
        return -1;
      }
      c = hex + 0xa9;
    }
    else {
      c = hex + 0xc9;
    }
  }
  else {
    c = hex + 0xd0;
  }
  return c;
}

Assistant:

static int8_t
hex_to_char(char hex) {
    uint8_t c = hex;

    if (c >= '0' && c <= '9') {
        c = c - 48;
    } else if (c >= 'A' && c <= 'F') {
        c = c - 55;  /* 65 - 10 */
    } else if (c >= 'a' && c <= 'f') {
        c = c - 87;  /* 97 - 10 */
    } else {
        return -1;
    }
    return c;
}